

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_refs_mark_task_CALL(WorkerP *w,Task *__dq_head)

{
  MDD **arg_1;
  MDD *arg_1_00;
  lddmc_refs_task_t arg_1_01;
  long in_FS_OFFSET;
  
  arg_1 = (MDD **)**(undefined8 **)(in_FS_OFFSET + -0x18);
  lddmc_refs_mark_p_par_SPAWN
            (w,__dq_head,arg_1,(*(undefined8 **)(in_FS_OFFSET + -0x18))[2] - (long)arg_1 >> 3);
  arg_1_00 = *(MDD **)(*(long *)(in_FS_OFFSET + -0x18) + 0x18);
  lddmc_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,arg_1_00,
             *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28) - (long)arg_1_00 >> 3);
  arg_1_01 = *(lddmc_refs_task_t *)(*(long *)(in_FS_OFFSET + -0x18) + 0x30);
  lddmc_refs_mark_s_par_CALL
            (w,__dq_head + 2,arg_1_01,
             *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x40) - (long)arg_1_01 >> 4);
  lddmc_refs_mark_r_par_SYNC(w,__dq_head + 1);
  lddmc_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(lddmc_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    SPAWN(lddmc_refs_mark_p_par, lddmc_refs_key->pbegin, lddmc_refs_key->pcur-lddmc_refs_key->pbegin);
    SPAWN(lddmc_refs_mark_r_par, lddmc_refs_key->rbegin, lddmc_refs_key->rcur-lddmc_refs_key->rbegin);
    CALL(lddmc_refs_mark_s_par, lddmc_refs_key->sbegin, lddmc_refs_key->scur-lddmc_refs_key->sbegin);
    SYNC(lddmc_refs_mark_r_par);
    SYNC(lddmc_refs_mark_p_par);
}